

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O2

UINT8 nes_apu_read(void *chip,uint8 offset)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,offset) == 0x15) {
    bVar1 = 0 < *(int *)((long)chip + 0xc);
    bVar3 = bVar1 + 2;
    if (*(int *)((long)chip + 0x34) < 1) {
      bVar3 = bVar1;
    }
    bVar2 = bVar3 + 4;
    if (*(int *)((long)chip + 100) < 1) {
      bVar2 = bVar3;
    }
    bVar3 = bVar2 | 8;
    if (*(int *)((long)chip + 0x88) < 1) {
      bVar3 = bVar2;
    }
    bVar2 = bVar3 | 0x10;
    if (*(char *)((long)chip + 0xb5) == '\0') {
      bVar2 = bVar3;
    }
    bVar3 = bVar2 | 0x40;
    if (*(char *)((long)chip + 0xf2) == '\0') {
      bVar3 = bVar2;
    }
    bVar2 = bVar3 | 0x80;
    if (*(char *)((long)chip + 0xb6) == '\0') {
      bVar2 = bVar3;
    }
    *(undefined1 *)((long)chip + 0xf2) = 0;
    return bVar2;
  }
  return *(UINT8 *)((long)chip + (ulong)offset + 0xd0);
}

Assistant:

uint8 nes_apu_read(void* chip, uint8 offset)
{
	nesapu_state *info = (nesapu_state*)chip;
	
	if (offset == 0x15) /*FIXED* Address $4015 has different behaviour*/
	{
		uint8 readval = 0;
		if (info->APU.squ[0].vbl_length > 0)
			readval |= 0x01;

		if (info->APU.squ[1].vbl_length > 0)
			readval |= 0x02;

		if (info->APU.tri.vbl_length > 0)
			readval |= 0x04;

		if (info->APU.noi.vbl_length > 0)
			readval |= 0x08;

		if (info->APU.dpcm.enabled)
			readval |= 0x10;

		if (info->APU.frame_irq_occurred)
			readval |= 0x40;

		if (info->APU.dpcm.irq_occurred)
			readval |= 0x80;

		info->APU.frame_irq_occurred = false;
		//if (!info->APU.dpcm.irq_occurred)
		//	info->irq_handler(false);

		return readval;
	}
	else
		return info->APU.regs[offset];
}